

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extract_tar_bz2.c
# Opt level: O0

void test_extract_tar_bz2(void)

{
  wchar_t line;
  wchar_t wVar1;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  int f;
  char *reffile;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  char *in_stack_00000400;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  char *f_00;
  undefined4 in_stack_fffffffffffffff0;
  char *filename;
  
  filename = "test_extract.tar.bz2";
  extract_reference_file(in_stack_00000400);
  line = systemf("%s -tf %s >test.out 2>test.err",testprog,filename);
  if ((line != L'\0') && (wVar1 = canBzip2(), wVar1 == L'\0')) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_bz2.c"
                   ,L'.');
    test_skipping("It seems bzip2 is not supported on this platform");
    return;
  }
  systemf("%s -xf %s >test.out 2>test.err",testprog,filename);
  f_00 = (char *)0x0;
  assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)filename,
                      (char *)CONCAT44(line,in_stack_fffffffffffffff0),0,(char *)0x10bc8b,
                      (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_file_exists(filename,line,f_00);
  assertion_text_file_contents(in_stack_00000028,in_stack_00000024,in_stack_00000018,reffile);
  assertion_file_exists(filename,line,f_00);
  assertion_text_file_contents(in_stack_00000028,in_stack_00000024,in_stack_00000018,reffile);
  assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
  assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
  return;
}

Assistant:

DEFINE_TEST(test_extract_tar_bz2)
{
	const char *reffile = "test_extract.tar.bz2";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s -tf %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canBzip2()) {
		assertEqualInt(0, systemf("%s -xf %s >test.out 2>test.err",
		    testprog, reffile));

		assertFileExists("file1");
		assertTextFileContents("contents of file1.\n", "file1");
		assertFileExists("file2");
		assertTextFileContents("contents of file2.\n", "file2");
		assertEmptyFile("test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems bzip2 is not supported on this platform");
	}
}